

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_args(Btor2Parser *bfr,Btor2Line *l,uint32_t nargs)

{
  int32_t iVar1;
  int64_t iVar2;
  uint in_EDX;
  Btor2Parser *in_RSI;
  Btor2Parser *in_RDI;
  uint32_t i;
  uint uVar3;
  int32_t local_4;
  
  uVar3 = 0;
  iVar1 = getc_bfr((Btor2Parser *)((ulong)in_EDX << 0x20));
  if (iVar1 == 0x20) {
    for (; uVar3 < in_EDX; uVar3 = uVar3 + 1) {
      iVar2 = parse_arg_bfr(in_RSI);
      *(int64_t *)(in_RSI[1].error + (ulong)uVar3 * 8) = iVar2;
      if (iVar2 == 0) {
        return 0;
      }
      if ((uVar3 < in_EDX - 1) &&
         (iVar1 = getc_bfr((Btor2Parser *)CONCAT44(in_EDX,uVar3)), iVar1 != 0x20)) {
        iVar1 = perr_bfr(in_RDI,"expected space after argument (argument missing)");
        return iVar1;
      }
    }
    *(uint *)&in_RSI->file = in_EDX;
    local_4 = 1;
  }
  else {
    local_4 = perr_bfr(in_RDI,"expected space after sort id");
  }
  return local_4;
}

Assistant:

static int32_t
parse_args (Btor2Parser *bfr, Btor2Line *l, uint32_t nargs)
{
  uint32_t i = 0;
  if (getc_bfr (bfr) != ' ')
    return perr_bfr (bfr, "expected space after sort id");
  while (i < nargs)
  {
    if (!(l->args[i] = parse_arg_bfr (bfr))) return 0;
    if (i < nargs - 1 && getc_bfr (bfr) != ' ')
      return perr_bfr (bfr, "expected space after argument (argument missing)");
    i++;
  }
  l->nargs = nargs;
  return 1;
}